

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  uint uVar1;
  char *key;
  uint uVar2;
  ulong size_00;
  uchar *__ptr;
  uchar *str;
  LodePNGInfo *local_70;
  ulong local_68;
  size_t size;
  LodePNGDecompressSettings zlibsettings;
  
  zlibsettings.custom_context = (decoder->zlibsettings).custom_context;
  zlibsettings.ignore_adler32 = (decoder->zlibsettings).ignore_adler32;
  zlibsettings.ignore_nlen = (decoder->zlibsettings).ignore_nlen;
  zlibsettings.max_output_size = (decoder->zlibsettings).max_output_size;
  zlibsettings.custom_zlib = (decoder->zlibsettings).custom_zlib;
  zlibsettings.custom_inflate = (decoder->zlibsettings).custom_inflate;
  str = (uchar *)0x0;
  size = 0;
  uVar2 = 2;
  while ((size_00 = (ulong)(uVar2 - 2), size_00 < chunkLength && (data[size_00] != '\0'))) {
    uVar2 = uVar2 + 1;
  }
  if (uVar2 < chunkLength) {
    if (uVar2 - 0x52 < 0xffffffb1) {
      uVar2 = 0x59;
    }
    else {
      local_68 = (ulong)(uVar2 - 1);
      local_70 = info;
      key = (char *)malloc(local_68);
      if (key != (char *)0x0) {
        lodepng_memcpy(key,data,size_00);
        key[size_00] = '\0';
        if (data[local_68] == '\0') {
          zlibsettings.max_output_size = decoder->max_text_size;
          uVar1 = zlib_decompress(&str,&size,0,data + uVar2,(ulong)((int)chunkLength - uVar2),
                                  &zlibsettings);
          uVar2 = 0x70;
          if (size <= zlibsettings.max_output_size) {
            uVar2 = uVar1;
          }
          if ((uVar1 == 0) || (__ptr = str, uVar2 == 0)) {
            uVar2 = lodepng_add_text_sized(local_70,key,(char *)str,size);
            __ptr = str;
          }
        }
        else {
          uVar2 = 0x48;
          __ptr = (uchar *)0x0;
        }
        goto LAB_0019f612;
      }
      uVar2 = 0x53;
    }
  }
  else {
    uVar2 = 0x4b;
  }
  key = (char *)0x0;
  __ptr = (uchar *)0x0;
LAB_0019f612:
  free(key);
  free(__ptr);
  return uVar2;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;

  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, string2_begin;
  char *key = 0;
  unsigned char* str = 0;
  size_t size = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    if(data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    string2_begin = length + 2;
    if(string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

    length = (unsigned)chunkLength - string2_begin;
    zlibsettings.max_output_size = decoder->max_text_size;
    /*will fail if zlib error, e.g. if length is too small*/
    error = zlib_decompress(&str, &size, 0, &data[string2_begin],
                            length, &zlibsettings);
    /*error: compressed text larger than  decoder->max_text_size*/
    if(error && size > zlibsettings.max_output_size) error = 112;
    if(error) break;
    error = lodepng_add_text_sized(info, key, (char*)str, size);
    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}